

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaL_checktype(lua_State *L,int narg,int t)

{
  int iVar1;
  
  iVar1 = lua_type(L,narg);
  if (iVar1 == t) {
    return;
  }
  tag_error(L,narg,t);
}

Assistant:

static void luaL_checktype(lua_State*L,int narg,int t){
if(lua_type(L,narg)!=t)
tag_error(L,narg,t);
}